

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

int Cec_ManPatComputePattern3_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int Value1_00;
  int fCompl0;
  int fCompl1;
  Gia_Obj_t *pGVar2;
  int Value;
  int Value1;
  int Value0;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                      ,0x102,"int Cec_ManPatComputePattern3_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Cec_ManPatComputePattern3_rec(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Value1_00 = Cec_ManPatComputePattern3_rec(p,pGVar2);
      fCompl0 = Gia_ObjFaninC0(pObj);
      fCompl1 = Gia_ObjFaninC1(pObj);
      p_local._4_4_ = Gia_XsimAndCond(iVar1,fCompl0,Value1_00,fCompl1);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | (ulong)(p_local._4_4_ & 1) << 0x1e;
      *(ulong *)pObj =
           *(ulong *)pObj & 0xbfffffffffffffff | (ulong)((int)p_local._4_4_ >> 1 & 1) << 0x3e;
    }
    else {
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
      *(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff | 0x4000000000000000;
      p_local._4_4_ = 3;
    }
  }
  else {
    p_local._4_4_ =
         ((uint)((ulong)*(undefined8 *)pObj >> 0x3e) & 1) << 1 | (uint)(*(ulong *)pObj >> 0x1e) & 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManPatComputePattern3_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Value0, Value1, Value;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return (pObj->fMark1 << 1) | pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark0 = 1;
        pObj->fMark1 = 1;
        return GIA_UND;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value1 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin1(pObj) );
    Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
    pObj->fMark0 =  (Value & 1);
    pObj->fMark1 = ((Value >> 1) & 1);
    return Value;
}